

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O1

bool have_schar(char *arg)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if (*arg == '\0') {
    return false;
  }
  cVar1 = *arg;
  if (cVar1 != '\0') {
    pcVar3 = arg + 1;
    do {
      if (((9 < (int)cVar1 - 0x30U) && (iVar2 = isalpha((int)cVar1), cVar1 != ' ')) && (iVar2 == 0))
      {
        return true;
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return false;
}

Assistant:

bool have_schar(char *arg)
{
	if (*arg == '\0')
		return false;

	for (; *arg != '\0'; arg++)
	{
		if (!isdigit(*arg) && !isalpha(*arg) && *arg != ' ')
			return true;
	}

	return false;
}